

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxsender.c
# Opt level: O0

void test_basic(void)

{
  quicly_sent_packet_t *pqVar1;
  size_t sVar2;
  size_t cnt;
  quicly_sent_packet_t *sent_1;
  quicly_sent_packet_t *sent;
  quicly_sentmap_iter_t iter;
  size_t i;
  uint64_t at;
  quicly_sentmap_t map;
  undefined6 in_stack_ffffffffffffff88;
  uint16_t in_stack_ffffffffffffff8e;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  quicly_sentmap_t *in_stack_ffffffffffffff98;
  long lVar3;
  undefined8 in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  quicly_sentmap_event_t in_stack_ffffffffffffffb4;
  quicly_sentmap_t *in_stack_ffffffffffffffb8;
  quicly_sentmap_t *in_stack_ffffffffffffffc0;
  ulong local_38;
  ulong local_30;
  quicly_sentmap_t local_28;
  
  quicly_sentmap_init((quicly_sentmap_t *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  for (local_30 = 0; local_30 < 10; local_30 = local_30 + 1) {
    for (local_38 = 1; local_38 < 6; local_38 = local_38 + 1) {
      quicly_sentmap_prepare
                (in_stack_ffffffffffffffb8,
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8,(uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38));
      quicly_sentmap_allocate
                (in_stack_ffffffffffffff98,
                 (quicly_sent_acked_cb)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
                );
      quicly_sentmap_allocate
                (in_stack_ffffffffffffff98,
                 (quicly_sent_acked_cb)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
                );
      quicly_sentmap_commit
                ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8e);
    }
  }
  quicly_sentmap_init_iter
            ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (quicly_sentmap_iter_t *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88))
  ;
  for (local_30 = 0; local_30 < 10; local_30 = local_30 + 1) {
    for (local_38 = 1; local_38 < 6; local_38 = local_38 + 1) {
      pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x1367b9);
      _ok((int)(ulong)(pqVar1->packet_number == local_30 * 5 + local_38),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x47);
      _ok((int)(ulong)(pqVar1->sent_at == local_30),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x48);
      _ok((int)(ulong)(pqVar1->ack_epoch == '\0'),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x49);
      _ok((int)(ulong)(pqVar1->cc_bytes_in_flight == 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x4a);
      quicly_sentmap_skip((quicly_sentmap_iter_t *)0x13688c);
    }
  }
  pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x1368be);
  _ok((int)(ulong)(pqVar1->packet_number == 0xffffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x4e);
  sVar2 = num_blocks(&local_28);
  _ok((int)(ulong)(sVar2 == 10),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x4f);
  quicly_sentmap_init_iter
            ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (quicly_sentmap_iter_t *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88))
  ;
  while (pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x13692d), pqVar1->packet_number < 0xb
        ) {
    quicly_sentmap_skip((quicly_sentmap_iter_t *)0x13693d);
  }
  pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x136949);
  if (pqVar1->packet_number != 0xb) {
    __assert_fail("quicly_sentmap_get(&iter)->packet_number == 11",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0x55,"void test_basic(void)");
  }
  while (pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x13697c),
        pqVar1->packet_number < 0x29) {
    quicly_sentmap_update
              (in_stack_ffffffffffffffc0,(quicly_sentmap_iter_t *)in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb4);
  }
  _ok((int)(ulong)(on_acked_callcnt == 0x3c),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x58);
  _ok((int)(ulong)(on_acked_ackcnt == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x59);
  lVar3 = 0;
  quicly_sentmap_init_iter
            ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (quicly_sentmap_iter_t *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88))
  ;
  while (pqVar1 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x136a0c),
        pqVar1->packet_number != 0xffffffffffffffff) {
    _ok((int)(ulong)(pqVar1->cc_bytes_in_flight != 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0x5e);
    in_stack_ffffffffffffff97 = true;
    if (10 < pqVar1->packet_number) {
      in_stack_ffffffffffffff97 = 0x28 < pqVar1->packet_number;
    }
    _ok((int)(ulong)(byte)in_stack_ffffffffffffff97,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0x5f);
    lVar3 = lVar3 + 1;
    quicly_sentmap_skip((quicly_sentmap_iter_t *)0x136aa9);
  }
  _ok((int)(ulong)(lVar3 == 0x14),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x62);
  sVar2 = num_blocks(&local_28);
  _ok((int)(ulong)(sVar2 == 5),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",99)
  ;
  quicly_sentmap_dispose
            ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  return;
}

Assistant:

static void test_basic(void)
{
    quicly_maxsender_t m;
    quicly_maxsender_sent_t ackargs;

    quicly_maxsender_init(&m, 100);

    /* basic checks */
    ok(!quicly_maxsender_should_send_max(&m, 0, 100, 512));
    ok(quicly_maxsender_should_send_max(&m, 0, 100, 1024));
    ok(!quicly_maxsender_should_send_max(&m, 99, 100, 0));
    ok(quicly_maxsender_should_send_max(&m, 100, 100, 0));

    /* scenario */
    ok(!quicly_maxsender_should_send_max(&m, 24, 100, 768));
    ok(quicly_maxsender_should_send_max(&m, 25, 100, 768));
    quicly_maxsender_record(&m, 125, &ackargs);
    ok(!quicly_maxsender_should_send_max(&m, 49, 100, 768));
    ok(quicly_maxsender_should_send_max(&m, 50, 100, 768));
    quicly_maxsender_acked(&m, &ackargs);
    ok(!quicly_maxsender_should_send_max(&m, 49, 100, 768));
    ok(quicly_maxsender_should_send_max(&m, 50, 100, 768));
    quicly_maxsender_record(&m, 150, &ackargs);
    ok(!quicly_maxsender_should_send_max(&m, 74, 100, 768));
    quicly_maxsender_lost(&m, &ackargs);
    ok(quicly_maxsender_should_send_max(&m, 74, 100, 768));
}